

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufstream.c
# Opt level: O1

err_t BufRead(bufstream *p,uint8_t *Data,size_t Size,size_t *Readed)

{
  stream *psVar1;
  size_t *psVar2;
  err_t eVar3;
  ulong uVar4;
  err_t eVar5;
  ulong uVar6;
  ulong local_50;
  size_t *local_48;
  uint8_t *local_40;
  size_t *local_38;
  
  local_48 = Readed;
  if (Size == 0) {
    uVar6 = 0;
    eVar3 = 0;
  }
  else {
    local_38 = &p->ReadSize;
    uVar6 = 0;
    eVar3 = 0;
    local_50 = Size;
    local_40 = Data;
    do {
      psVar2 = local_38;
      if (p->ReadSize <= p->ReadPos) {
        if (0x1000 < local_50) {
          psVar1 = p->Stream;
          if (psVar1 == (stream *)0x0) {
            __assert_fail("(const void*)(p->Stream)!=NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/helpers/file/bufstream.c"
                          ,0x41,"err_t BufRead(bufstream *, uint8_t *, size_t, size_t *)");
          }
          eVar3 = (**(code **)((long)(psVar1->Base).VMT + 0x58))
                            (psVar1,local_40 + uVar6,local_50,&local_50);
          if (local_48 == (size_t *)0x0) {
            return eVar3;
          }
          *local_48 = uVar6 + local_50;
          return eVar3;
        }
        p->ReadPos = 0;
        psVar1 = p->Stream;
        if (psVar1 == (stream *)0x0) {
          __assert_fail("(const void*)(p->Stream)!=NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/helpers/file/bufstream.c"
                        ,0x48,"err_t BufRead(bufstream *, uint8_t *, size_t, size_t *)");
        }
        eVar3 = (**(code **)((long)(psVar1->Base).VMT + 0x58))(psVar1,p->Buffer,0x1000,local_38);
        if (*psVar2 == 0) break;
      }
      uVar4 = p->ReadSize - p->ReadPos;
      if (uVar4 < local_50) {
        local_50 = uVar4;
      }
      uVar4 = local_50;
      memcpy(local_40 + uVar6,p->Buffer + p->ReadPos,local_50);
      p->ReadPos = p->ReadPos + uVar4;
      uVar6 = uVar6 + uVar4;
      local_50 = Size - uVar6;
    } while (local_50 != 0);
  }
  if (local_48 != (size_t *)0x0) {
    *local_48 = uVar6;
  }
  eVar5 = 0;
  if (uVar6 < Size) {
    eVar5 = eVar3;
  }
  return eVar5;
}

Assistant:

static err_t BufRead(bufstream* p,uint8_t* Data,size_t Size,size_t* Readed)
{
    err_t Err = ERR_NONE;
    size_t Pos = 0;
    size_t Left;

    while ((Left = (Size - Pos)) > 0)
    {
        if (p->ReadSize <= p->ReadPos)
        {
            if (Left > BUFSTREAM_SIZE)
            {
                Err = Stream_Read(p->Stream,Data+Pos,Left,&Left);
                if (Readed)
                    *Readed = Pos+Left;
                return Err;
            }

            p->ReadPos = 0;
            Err = Stream_Read(p->Stream,p->Buffer,BUFSTREAM_SIZE,&p->ReadSize);
            if (p->ReadSize <= 0)
                break;
        }

        if (Left > p->ReadSize - p->ReadPos)
            Left = p->ReadSize - p->ReadPos;

        memcpy(Data+Pos,p->Buffer+p->ReadPos,Left);
        Pos += Left;
        p->ReadPos += Left;
    }

    if (Readed)
        *Readed = Pos;

    if (Pos >= Size)
        Err = ERR_NONE; //override possible end of file in later of the buffer
    return Err;
}